

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  double *pdVar2;
  pointer piVar3;
  ostream *poVar4;
  double *time;
  double *pdVar5;
  size_t size;
  size_t i;
  ulong uVar6;
  initializer_list<int> __l;
  initializer_list<const_char_*> __l_00;
  initializer_list<const_char_*> __l_01;
  Treap<unsigned_long> tp;
  SplayTree<unsigned_long> st;
  vector<const_char_*,_std::allocator<const_char_*>_> structure;
  vector<unsigned_long,_std::allocator<unsigned_long>_> insertable;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  vector<unsigned_long,_std::allocator<unsigned_long>_> whole;
  vector<unsigned_long,_std::allocator<unsigned_long>_> init;
  undefined1 local_128 [32];
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> set;
  vector<const_char_*,_std::allocator<const_char_*>_> ops;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  res;
  vector<unsigned_long,_std::allocator<unsigned_long>_> eraseable;
  vector<unsigned_long,_std::allocator<unsigned_long>_> findable;
  vector<int,_std::allocator<int>_> n;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  set._M_t._M_impl._0_8_ = 0x186a000004e20;
  set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 500000;
  set._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 2500000;
  __l._M_len = 4;
  __l._M_array = (iterator)&set._M_t;
  std::vector<int,_std::allocator<int>_>::vector(&n,__l,(allocator_type *)local_128);
  for (piVar3 = n.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar3 != n.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish; piVar3 = piVar3 + 1) {
    iVar1 = *piVar3;
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    poVar4 = std::operator<<(poVar4," elements");
    std::endl<char,std::char_traits<char>>(poVar4);
    st.root = (Node *)0x0;
    tp.root = (Node *)0x0;
    set._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         set._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &set._M_t._M_impl.super__Rb_tree_header._M_header;
    set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    randVec(&init,(long)iVar1);
    size = (size_t)(iVar1 / 10);
    randVec(&insertable,size);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&whole,&init);
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&whole,
               (const_iterator)
               whole.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )insertable.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )insertable.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,&whole);
    getRandomPart(&findable,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,size)
    ;
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60,&whole);
    getRandomPart(&eraseable,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60,size
                 );
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_60);
    initialize<SplayTree<unsigned_long>,Treap<unsigned_long>,std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
              (&init,&st,&tp,
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &set._M_t);
    run<SplayTree<unsigned_long>,Treap<unsigned_long>,std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
              (&res,&insertable,&findable,&eraseable,&st,&tp,
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &set._M_t);
    local_128._16_8_ = "erase";
    local_128._0_8_ = "insert";
    local_128._8_8_ = "find ";
    __l_00._M_len = 3;
    __l_00._M_array = (iterator)local_128;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              (&ops,__l_00,(allocator_type *)&local_178);
    local_128._16_8_ = "std::set";
    local_128._0_8_ = "SplayTree";
    local_128._8_8_ = "Treap ";
    __l_01._M_len = 3;
    __l_01._M_array = (iterator)local_128;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              (&structure,__l_01,(allocator_type *)&local_178);
    *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
    poVar4 = std::operator<<(&std::cout,0x20);
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xd;
    std::operator<<(poVar4,"");
    for (uVar6 = 0;
        uVar6 < (ulong)((long)structure.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)structure.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3); uVar6 = uVar6 + 1) {
      *(undefined8 *)(std::random_device::_M_getval + *(long *)(std::cout + -0x18)) = 0xd;
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_178,(char)uVar6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                     &local_178,
                     structure.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar6]);
      std::operator<<((ostream *)&std::cout,(string *)local_128);
      std::__cxx11::string::~string((string *)local_128);
      std::__cxx11::string::~string((string *)&local_178);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    for (uVar6 = 0;
        uVar6 < (ulong)((long)structure.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)structure.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3); uVar6 = uVar6 + 1) {
      *(undefined8 *)(std::random_device::_M_getval + *(long *)(std::cout + -0x18)) = 0xd;
      std::operator<<((ostream *)&std::cout,
                      ops.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar6]);
      pdVar2 = res.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar6].
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      for (pdVar5 = res.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar6].
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start; pdVar5 != pdVar2; pdVar5 = pdVar5 + 1) {
        *(undefined8 *)(std::random_device::_M_getval + *(long *)(std::cout + -0x18)) = 0xd;
        poVar4 = std::ostream::_M_insert<double>(*pdVar5);
        std::operator<<(poVar4," ");
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              (&structure.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              (&ops.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&res);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&eraseable.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&findable.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&whole.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&insertable.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&init.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree(&set._M_t);
    Treap<unsigned_long>::~Treap(&tp);
    SplayTree<unsigned_long>::~SplayTree(&st);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&n.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int main() {
  std::vector n{20'000, 100'000, 500'000, 2'500'000};

  for (auto n : n) {
    std::cout << n << " elements" << std::endl;

    SplayTree<std::uint64_t> st;
    Treap<std::uint64_t> tp;
    std::set<std::uint64_t> set;

    auto init = randVec(n);
    auto insertable = randVec(n / 10);

    auto whole = init;
    whole.insert(whole.end(), insertable.begin(), insertable.end());

    auto findable = getRandomPart(whole, n / 10);
    auto eraseable = getRandomPart(whole, n / 10);

    initialize(init, st, tp, set);
    auto res = run(insertable, findable, eraseable, st, tp, set);

    std::vector ops{"insert", "find ", "erase"};
    std::vector structure{"SplayTree", "Treap ", "std::set"};

    std::cout << std::left << std::setfill(' ') << std::setw(13) << "";
    for (std::size_t i = 0; i < structure.size(); ++i)
      std::cout << std::setw(13) << std::string(i, ' ') + structure[i];
    std::cout << std::endl;

    for (std::size_t i = 0; i < structure.size(); ++i) {
      std::cout << std::setw(13) << ops[i];
      for (auto &time : res[i])
        std::cout << std::setw(13) << time << " ";
      std::cout << std::endl;
    }
  }
}